

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

int4 __thiscall
RuleOrPredicate::checkSingle
          (RuleOrPredicate *this,Varnode *vn,MultiPredicate *branch,PcodeOp *op,Funcdata *data)

{
  bool bVar1;
  Varnode *pVVar2;
  PcodeOp *pPVar3;
  Funcdata *data_local;
  PcodeOp *op_local;
  MultiPredicate *branch_local;
  Varnode *vn_local;
  RuleOrPredicate *this_local;
  
  bVar1 = Varnode::isFree(vn);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = MultiPredicate::discoverCbranch(branch);
    if (bVar1) {
      pVVar2 = PcodeOp::getOut(branch->op);
      pPVar3 = Varnode::loneDescend(pVVar2);
      if (pPVar3 == op) {
        MultiPredicate::discoverPathIsTrue(branch);
        bVar1 = MultiPredicate::discoverConditionalZero(branch,vn);
        if (bVar1) {
          if ((branch->zeroPathIsTrue & 1U) == 0) {
            Funcdata::opSetInput(data,branch->op,vn,branch->zeroSlot);
            Funcdata::opRemoveInput(data,op,1);
            Funcdata::opSetOpcode(data,op,CPUI_COPY);
            pVVar2 = PcodeOp::getOut(branch->op);
            Funcdata::opSetInput(data,op,pVVar2,0);
            this_local._4_4_ = 1;
          }
          else {
            this_local._4_4_ = 0;
          }
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int4 RuleOrPredicate::checkSingle(Varnode *vn,MultiPredicate &branch,PcodeOp *op,Funcdata &data)

{
  if (vn->isFree()) return 0;
  if (!branch.discoverCbranch()) return 0;
  if (branch.op->getOut()->loneDescend() != op) return 0;	// Must only be one use of MULTIEQUAL, because we rewrite it
  branch.discoverPathIsTrue();
  if (!branch.discoverConditionalZero(vn)) return 0;
  if (branch.zeroPathIsTrue) return 0;		// true condition (vn == 0) must not go to zero set
  data.opSetInput(branch.op,vn,branch.zeroSlot);
  data.opRemoveInput(op,1);
  data.opSetOpcode(op,CPUI_COPY);
  data.opSetInput(op,branch.op->getOut(),0);
  return 1;
}